

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O3

bool cmLoadCacheCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  string *prefix;
  char cVar1;
  cmMakefile *this;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  cmake *pcVar6;
  char *pcVar7;
  char *pcVar8;
  pointer pbVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *arg;
  pointer pbVar10;
  char *pcVar11;
  string line;
  string cacheFile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variablesToRead;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  excludes;
  long *local_12d8 [2];
  long local_12c8 [2];
  char *local_12b8;
  long local_12b0;
  char local_12a8;
  undefined7 uStack_12a7;
  string local_1298;
  cmMakefile *local_1278;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1270;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1240 [10];
  undefined1 local_1038 [8];
  undefined1 local_1030 [24];
  _Base_ptr local_1018;
  size_t local_1010;
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 == pbVar9) {
    local_1038 = (undefined1  [8])(local_1038 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1038,"called with wrong number of arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else if (((ulong)((long)pbVar9 - (long)pbVar10) < 0x21) ||
          (iVar5 = std::__cxx11::string::compare((char *)(pbVar10 + 1)), iVar5 != 0)) {
    pcVar6 = cmMakefile::GetCMakeInstance(status->Makefile);
    if (pcVar6->CurrentWorkingMode != SCRIPT_MODE) {
      local_1030._16_8_ = local_1038 + 8;
      local_1030._0_8_ = local_1030._0_8_ & 0xffffffff00000000;
      local_1030._8_8_ = (_Base_ptr)0x0;
      local_1010 = 0;
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_1018 = (_Base_ptr)local_1030._16_8_;
      if (pbVar10 == pbVar9) {
        local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1240[0]._M_impl.super__Rb_tree_header._M_header;
        local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1240[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      else {
        bVar4 = false;
        do {
          if (bVar4) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_1038,pbVar10);
          }
          iVar5 = std::__cxx11::string::compare((char *)pbVar10);
          if (iVar5 == 0) {
            bVar4 = true;
          }
        } while (((!bVar4) || (iVar5 = std::__cxx11::string::compare((char *)pbVar10), iVar5 != 0))
                && (pbVar10 = pbVar10 + 1, pbVar10 != pbVar9));
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1240[0]._M_impl.super__Rb_tree_header._M_header;
        local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1240[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_left;
        if (pbVar10 != pbVar9) {
          bVar4 = false;
          do {
            if (bVar4) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_1240,pbVar10);
            }
            iVar5 = std::__cxx11::string::compare((char *)pbVar10);
            if (iVar5 == 0) {
              bVar4 = true;
            }
          } while (((!bVar4) || (iVar5 = std::__cxx11::string::compare((char *)pbVar10), iVar5 != 0)
                   ) && (pbVar10 = pbVar10 + 1, pbVar10 != pbVar9));
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar9 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        if (pbVar10 != pbVar9) {
          this = status->Makefile;
          do {
            iVar5 = std::__cxx11::string::compare((char *)pbVar10);
            if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)pbVar10), iVar5 == 0)
               ) break;
            pcVar6 = cmMakefile::GetCMakeInstance(this);
            cmake::LoadCache(pcVar6,pbVar10,false,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_1038,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_1240);
            pbVar10 = pbVar10 + 1;
          } while (pbVar10 != pbVar9);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(local_1240);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1038);
      return true;
    }
    local_1038 = (undefined1  [8])(local_1038 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1038,"Only load_cache(READ_WITH_PREFIX) may be used in script mode",
               "");
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (0x40 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10)) {
      local_1298._M_dataplus._M_p = (pointer)&local_1298.field_2;
      pcVar2 = (pbVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1298,pcVar2,pcVar2 + pbVar10->_M_string_length);
      std::__cxx11::string::append((char *)&local_1298);
      bVar4 = cmsys::SystemTools::FileExists(&local_1298);
      if (bVar4) {
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        set<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_1270,pbVar10 + 3,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
        std::ifstream::ifstream(local_1240,local_1298._M_dataplus._M_p,_S_in);
        local_12b8 = &local_12a8;
        local_12b0 = 0;
        local_12a8 = '\0';
        if ((*(byte *)((long)&local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_right +
                      (long)((_Base_ptr)(local_1240[0]._M_impl._0_8_ + -0x20))->_M_parent) & 5) == 0
           ) {
          prefix = pbVar10 + 2;
          local_1278 = status->Makefile;
          do {
            std::istream::read((char *)local_1240,(long)local_1038);
            if (CONCAT44(local_1240[0]._M_impl.super__Rb_tree_header._M_header._4_4_,
                         local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_color) != 0) {
              pcVar11 = local_1038 +
                        CONCAT44(local_1240[0]._M_impl.super__Rb_tree_header._M_header._4_4_,
                                 local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_color);
              pcVar7 = local_1038;
              pcVar8 = pcVar7;
LAB_0048cbd8:
              do {
                cVar1 = *pcVar7;
                pcVar3 = pcVar7;
                if (cVar1 != '\n') {
                  pcVar7 = pcVar7 + 1;
                  pcVar3 = pcVar11;
                  if (pcVar7 != pcVar11) goto LAB_0048cbd8;
                }
                pcVar7 = pcVar3;
                local_12d8[0] = local_12c8;
                if ((pcVar7 == pcVar8) || (pcVar7[-1] != '\r')) {
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_12d8,pcVar8,pcVar7);
                  std::__cxx11::string::_M_append((char *)&local_12b8,(ulong)local_12d8[0]);
                }
                else {
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_12d8,pcVar8,pcVar7 + -1);
                  std::__cxx11::string::_M_append((char *)&local_12b8,(ulong)local_12d8[0]);
                }
                if (local_12d8[0] != local_12c8) {
                  operator_delete(local_12d8[0],local_12c8[0] + 1);
                }
                if (cVar1 == '\n') {
                  CheckLine(local_1278,prefix,
                            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_1270,local_12b8);
                  local_12b0 = 0;
                  *local_12b8 = '\0';
                  pcVar7 = pcVar7 + 1;
                }
                pcVar8 = pcVar7;
              } while (pcVar7 != pcVar11);
            }
          } while ((*(byte *)((long)&local_1240[0]._M_impl.super__Rb_tree_header._M_header._M_right
                             + (long)((_Base_ptr)(local_1240[0]._M_impl._0_8_ + -0x20))->_M_parent)
                   & 5) == 0);
          if (local_12b0 != 0) {
            CheckLine(local_1278,prefix,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1270,local_12b8);
          }
          if (local_12b8 != &local_12a8) {
            operator_delete(local_12b8,CONCAT71(uStack_12a7,local_12a8) + 1);
          }
        }
        std::ifstream::~ifstream(local_1240);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_1270);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1038,"Cannot load cache file from ",&local_1298);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if (local_1038 != (undefined1  [8])(local_1038 + 0x10)) {
          operator_delete((void *)local_1038,(ulong)(local_1030._8_8_ + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1298._M_dataplus._M_p == &local_1298.field_2) {
        return bVar4;
      }
      operator_delete(local_1298._M_dataplus._M_p,local_1298.field_2._M_allocated_capacity + 1);
      return bVar4;
    }
    local_1038 = (undefined1  [8])(local_1038 + 0x10);
    local_1240[0]._M_impl._0_8_ = (_Base_ptr)0x2c;
    local_1038 = (undefined1  [8])
                 std::__cxx11::string::_M_create((ulong *)local_1038,(ulong)local_1240);
    local_1030._8_8_ = local_1240[0]._M_impl._0_8_;
    builtin_strncpy((char *)local_1038,"READ_WITH_PREFIX form must specify a prefix.",0x2c);
    local_1030._0_8_ = local_1240[0]._M_impl._0_8_;
    *(char *)((long)local_1038 + local_1240[0]._M_impl._0_8_) = '\0';
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  if (local_1038 != (undefined1  [8])(local_1038 + 0x10)) {
    operator_delete((void *)local_1038,(ulong)(local_1030._8_8_ + 1));
  }
  return false;
}

Assistant:

bool cmLoadCacheCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with wrong number of arguments.");
    return false;
  }

  if (args.size() >= 2 && args[1] == "READ_WITH_PREFIX") {
    return ReadWithPrefix(args, status);
  }

  if (status.GetMakefile().GetCMakeInstance()->GetWorkingMode() ==
      cmake::SCRIPT_MODE) {
    status.SetError(
      "Only load_cache(READ_WITH_PREFIX) may be used in script mode");
    return false;
  }

  // Cache entries to be excluded from the import list.
  // If this set is empty, all cache entries are brought in
  // and they can not be overridden.
  bool excludeFiles = false;
  std::set<std::string> excludes;

  for (std::string const& arg : args) {
    if (excludeFiles) {
      excludes.insert(arg);
    }
    if (arg == "EXCLUDE") {
      excludeFiles = true;
    }
    if (excludeFiles && (arg == "INCLUDE_INTERNALS")) {
      break;
    }
  }

  // Internal cache entries to be imported.
  // If this set is empty, no internal cache entries are
  // brought in.
  bool includeFiles = false;
  std::set<std::string> includes;

  for (std::string const& arg : args) {
    if (includeFiles) {
      includes.insert(arg);
    }
    if (arg == "INCLUDE_INTERNALS") {
      includeFiles = true;
    }
    if (includeFiles && (arg == "EXCLUDE")) {
      break;
    }
  }

  cmMakefile& mf = status.GetMakefile();

  // Loop over each build directory listed in the arguments.  Each
  // directory has a cache file.
  for (std::string const& arg : args) {
    if ((arg == "EXCLUDE") || (arg == "INCLUDE_INTERNALS")) {
      break;
    }
    mf.GetCMakeInstance()->LoadCache(arg, false, excludes, includes);
  }

  return true;
}